

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# teglGetProcAddressTests.cpp
# Opt level: O0

void __thiscall
deqp::egl::GetProcAddressExtensionCase::GetProcAddressExtensionCase
          (GetProcAddressExtensionCase *this,EglTestContext *eglTestCtx,char *name,char *description
          ,string *extName)

{
  string *extName_local;
  char *description_local;
  char *name_local;
  EglTestContext *eglTestCtx_local;
  GetProcAddressExtensionCase *this_local;
  
  GetProcAddressCase::GetProcAddressCase
            (&this->super_GetProcAddressCase,eglTestCtx,name,description);
  (this->super_GetProcAddressCase).super_TestCase.super_TestCase.super_TestNode._vptr_TestNode =
       (_func_int **)&PTR__GetProcAddressExtensionCase_0327cf08;
  std::__cxx11::string::string((string *)&this->m_extName,(string *)extName);
  return;
}

Assistant:

GetProcAddressExtensionCase (EglTestContext& eglTestCtx, const char* name, const char* description, const std::string& extName)
		: GetProcAddressCase	(eglTestCtx, name, description)
		, m_extName				(extName)
	{
	}